

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

StackSym * __thiscall Lowerer::GetTempNumberSym(Lowerer *this,Opnd *opnd,bool isTempTransferred)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *stackSym;
  RegOpnd *pRVar5;
  
  bVar3 = IR::Opnd::IsRegOpnd(opnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2321,"(opnd->IsRegOpnd())","Expected regOpnd");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (isTempTransferred) {
    stackSym = StackSym::New(TyMisc,this->m_func);
    Func::StackAllocate(this->m_func,stackSym,8);
  }
  else {
    pRVar5 = IR::Opnd::AsRegOpnd(opnd);
    pSVar1 = pRVar5->m_sym;
    stackSym = pSVar1->m_tempNumberSym;
    if (stackSym == (StackSym *)0x0) {
      stackSym = StackSym::New(TyMisc,this->m_func);
      Func::StackAllocate(this->m_func,stackSym,8);
      pSVar1->m_tempNumberSym = stackSym;
    }
  }
  return stackSym;
}

Assistant:

StackSym *
Lowerer::GetTempNumberSym(IR::Opnd * opnd, bool isTempTransferred)
{
    AssertMsg(opnd->IsRegOpnd(), "Expected regOpnd");

    if (isTempTransferred)
    {
        StackSym * tempNumberSym = StackSym::New(TyMisc, m_func);
        this->m_func->StackAllocate(tempNumberSym, sizeof(Js::JavascriptNumber));
        return tempNumberSym;
    }
    StackSym * stackSym = opnd->AsRegOpnd()->m_sym;
    StackSym * tempNumberSym = stackSym->m_tempNumberSym;

    if (tempNumberSym == nullptr)
    {
        tempNumberSym = StackSym::New(TyMisc, m_func);
        this->m_func->StackAllocate(tempNumberSym, sizeof(Js::JavascriptNumber));
        stackSym->m_tempNumberSym = tempNumberSym;
    }
    return tempNumberSym;
}